

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

string_type * __thiscall
booster::locale::impl_std::std_converter<char>::convert_abi_cxx11_
          (string_type *__return_storage_ptr__,std_converter<char> *this,conversion_type how,
          char_type *begin,char_type *end,int param_4)

{
  ctype *pcVar1;
  size_t __n;
  vector<char,_std::allocator<char>_> res;
  allocator_type local_4a;
  value_type local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  if (how - upper_case < 3) {
    pcVar1 = std::use_facet<std::ctype<char>>(&this->base_);
    local_49 = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,(size_type)(end + (1 - (long)begin))
               ,&local_49,&local_4a);
    __n = (long)end - (long)begin;
    if (__n != 0) {
      memmove(local_48._M_impl.super__Vector_impl_data._M_start,begin,__n);
    }
    (**(code **)((ulong)(how != upper_case) * 0x10 + 0x18 + *(long *)pcVar1))
              (pcVar1,local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_start + __n);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_start + __n);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,begin,end);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case converter_base::upper_case:
        case converter_base::lower_case:
        case converter_base::case_folding:
            {
                ctype_type const &ct=std::use_facet<ctype_type>(base_);
                size_t len = end - begin;
                std::vector<char_type> res(len+1,0);
                char_type *lbegin = &res[0];
                std::copy(begin,end,lbegin);
                if(how == converter_base::upper_case)
                    ct.toupper(lbegin,lbegin+len);
                else
                    ct.tolower(lbegin,lbegin+len);
                return string_type(lbegin,len);
            }
        default:
            return string_type(begin,end-begin);
        }
    }